

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::EmitterBeam::~EmitterBeam(EmitterBeam *this)

{
  pointer pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EmitterBeam_002248f0;
  pTVar1 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (this->m_vTrackJamTargets).
           super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pTVar3 = pTVar1;
  if (pTVar2 != pTVar1) {
    do {
      (**(pTVar3->super_EntityIdentifier).super_SimulationIdentifier.super_DataTypeBase.
         _vptr_DataTypeBase)(pTVar3);
      pTVar3 = pTVar3 + 1;
    } while (pTVar3 != pTVar2);
    (this->m_vTrackJamTargets).
    super__Vector_base<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
    ._M_impl.super__Vector_impl_data._M_finish = pTVar1;
  }
  std::
  vector<KDIS::DATA_TYPE::TrackJamTargetIdentifier,_std::allocator<KDIS::DATA_TYPE::TrackJamTargetIdentifier>_>
  ::~vector(&this->m_vTrackJamTargets);
  JammingTechnique::~JammingTechnique(&this->m_JammingTechnique);
  BeamStatus::~BeamStatus(&this->m_BeamStatus);
  DataTypeBase::~DataTypeBase(&(this->m_FundamentalParameterData).super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

EmitterBeam::~EmitterBeam()
{
    m_vTrackJamTargets.clear();
}